

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M3DExporter.cpp
# Opt level: O2

m3dv_t * AddVrtx(m3dv_t *vrtx,uint32_t *numvrtx,m3dv_t *v,uint32_t *idx)

{
  m3dv_t *pmVar1;
  uint uVar2;
  M3D_INDEX MVar3;
  M3D_FLOAT MVar4;
  M3D_FLOAT MVar5;
  M3D_FLOAT MVar6;
  m3dv_t *pmVar7;
  
  if ((v->x == 0.0) && (!NAN(v->x))) {
    v->x = 0.0;
  }
  if ((v->y == 0.0) && (!NAN(v->y))) {
    v->y = 0.0;
  }
  if ((v->z == 0.0) && (!NAN(v->z))) {
    v->z = 0.0;
  }
  if ((v->w == 0.0) && (!NAN(v->w))) {
    v->w = 0.0;
  }
  pmVar7 = (m3dv_t *)realloc(vrtx,(ulong)(*numvrtx + 1) * 0x18);
  uVar2 = *numvrtx;
  MVar3 = v->skinid;
  pmVar7[uVar2].color = v->color;
  pmVar7[uVar2].skinid = MVar3;
  MVar4 = v->y;
  MVar5 = v->z;
  MVar6 = v->w;
  pmVar1 = pmVar7 + uVar2;
  pmVar1->x = v->x;
  pmVar1->y = MVar4;
  pmVar1->z = MVar5;
  pmVar1->w = MVar6;
  *idx = uVar2;
  *numvrtx = uVar2 + 1;
  return pmVar7;
}

Assistant:

m3dv_t *AddVrtx(m3dv_t *vrtx, uint32_t *numvrtx, m3dv_t *v, uint32_t *idx) {
	if (v->x == (M3D_FLOAT)-0.0) v->x = (M3D_FLOAT)0.0;
	if (v->y == (M3D_FLOAT)-0.0) v->y = (M3D_FLOAT)0.0;
	if (v->z == (M3D_FLOAT)-0.0) v->z = (M3D_FLOAT)0.0;
	if (v->w == (M3D_FLOAT)-0.0) v->w = (M3D_FLOAT)0.0;
	vrtx = (m3dv_t *)M3D_REALLOC(vrtx, ((*numvrtx) + 1) * sizeof(m3dv_t));
	memcpy(&vrtx[*numvrtx], v, sizeof(m3dv_t));
	*idx = *numvrtx;
	(*numvrtx)++;
	return vrtx;
}